

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::checkPersistentEditorFocus(QAbstractItemViewPrivate *this)

{
  long lVar1;
  bool bVar2;
  QModelIndex *lhs;
  QWidget *pQVar3;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QModelIndex index;
  QWidget *widget;
  QAbstractItemViewPrivate *index_00;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = in_RDI;
  lhs = (QModelIndex *)q_func(in_RDI);
  pQVar3 = QApplication::focusWidget();
  if ((pQVar3 != (QWidget *)0x0) &&
     (bVar2 = QSet<QWidget_*>::contains((QSet<QWidget_*> *)lhs,(QWidget **)in_RDI), bVar2)) {
    indexForEditor(in_stack_ffffffffffffffc0,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x803b16);
    QItemSelectionModel::currentIndex();
    bVar2 = ::operator!=(lhs,(QModelIndex *)in_RDI);
    if (bVar2) {
      QAbstractItemView::setCurrentIndex
                ((QAbstractItemView *)in_stack_ffffffffffffffc0,(QModelIndex *)index_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::checkPersistentEditorFocus()
{
    Q_Q(QAbstractItemView);
    if (QWidget *widget = QApplication::focusWidget()) {
        if (persistent.contains(widget)) {
            //a persistent editor has gained the focus
            QModelIndex index = indexForEditor(widget);
            if (selectionModel->currentIndex() != index)
                q->setCurrentIndex(index);
        }
    }
}